

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::append
          (region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t offset,uint64_t bytes_to_map)

{
  bool write_enabled;
  in_memory *file;
  pointer psVar1;
  element_type *peVar2;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *prVar3;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *prVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<pstore::memory_mapper_base> local_48;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *local_38;
  
  if (regions.ptr_ ==
      (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
       *)0x0) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7c);
  }
  uVar8 = this->minimum_size_;
  if (offset % uVar8 != 0) {
    assert_failed("offset % minimum_size_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7d);
  }
  uVar9 = (bytes_to_map + uVar8) - 1;
  uVar9 = uVar9 - uVar9 % uVar8;
  prVar4 = this;
  prVar3 = local_38;
  if (uVar9 % uVar8 != 0) {
    assert_failed("bytes_to_map % minimum_size_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7f);
  }
  while( true ) {
    local_38 = prVar4;
    if (uVar9 == 0) {
      psVar6 = ((regions.ptr_)->
               super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = ((regions.ptr_)->
               super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (psVar6 != psVar1) {
        uVar7 = 0;
        do {
          peVar2 = (psVar6->
                   super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (peVar2->offset_ != uVar7) {
            local_38 = prVar3;
            assert_failed("region->offset () == p",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                          ,0xb4);
          }
          uVar7 = uVar7 + peVar2->size_;
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar1);
      }
      return;
    }
    uVar8 = local_38->full_size_;
    if (uVar9 < local_38->full_size_) {
      uVar8 = uVar9;
    }
    if (uVar8 < local_38->minimum_size_) break;
    file = (local_38->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    write_enabled = file->writable_;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00275070;
    in_memory_mapper::in_memory_mapper
              ((in_memory_mapper *)(p_Var5 + 1),file,write_enabled,offset,uVar8);
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__mock_mapper_002750c0;
    testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
              ((UntypedFunctionMockerBase *)(p_Var5 + 4));
    p_Var5[4]._vptr__Sp_counted_base = (_func_int **)&PTR__FunctionMocker_00275520;
    local_48.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var5 + 1);
    local_48.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var5;
    std::
    vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
    ::emplace_back<std::shared_ptr<pstore::memory_mapper_base>>
              ((vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
                *)regions.ptr_,&local_48);
    if (local_48.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar9 = uVar9 - uVar8;
    offset = offset + local_38->full_size_;
    prVar4 = local_38;
    prVar3 = local_38;
  }
  assert_failed("size >= minimum_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xa2);
}

Assistant:

void region_builder<File, MemoryMapper>::append (gsl::not_null<container_type *> regions,
                                                         std::uint64_t offset,
                                                         std::uint64_t bytes_to_map) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (offset % minimum_size_ == 0);
            bytes_to_map = round_up (bytes_to_map, minimum_size_);
            PSTORE_ASSERT (bytes_to_map % minimum_size_ == 0);

            // Zero or more regions whose size is a multiple of minimum-size but no
            // more than full-size.
            while (bytes_to_map > 0) {
                // Map no more than "full size" in one go.
                std::uint64_t const size = std::min (full_size_, bytes_to_map);

                bytes_to_map -= size;
                this->push (regions, bytes_to_map,
                            offset, // start of region
                            size);  // size of region
                offset += full_size_;
            }
            this->check_regions_are_contiguous (*regions);
        }